

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void print_usage(char *command,char *default_flags)

{
  size_t sVar1;
  char *__format;
  ulong uVar2;
  
  printf("Usage %s <rom_file> [flags [seed [sprite]]] <output_dir>\n",command);
  putchar(10);
  puts("A randomizer for Dragon Warrior for NES");
  putchar(10);
  putchar(10);
  printf("If flags are not specified, the flags \"%s\" will be used\n",default_flags);
  puts("If the seed is not specified, a random seed will be chosen");
  putchar(10);
  printf("Sprite should be one of: ");
  uVar2 = 0;
  while( true ) {
    sVar1 = sprite_count();
    if (sVar1 <= uVar2) break;
    __format = ", %s";
    if (uVar2 == 0) {
      __format = "%s";
    }
    printf(__format,dwr_sprite_names[uVar2]);
    uVar2 = uVar2 + 1;
  }
  putchar(10);
  return;
}

Assistant:

static void print_usage(const char *command, char *default_flags)
{
    size_t i;

    printf("Usage %s <rom_file> [flags [seed [sprite]]] <output_dir>\n", command);
    printf("\n");
    printf("A randomizer for Dragon Warrior for NES\n");
    printf("\n");
    printf("\n");
    printf("If flags are not specified, the flags \"%s\" will be used\n",
            default_flags);
    printf("If the seed is not specified, a random seed will be chosen\n");
    printf("\n");
    printf("Sprite should be one of: ");
    for(i=0; i < sprite_count(); i++) {
        if (i) {
            printf(", %s", dwr_sprite_names[i]);
        } else {
            printf("%s", dwr_sprite_names[i]);
        }
    }
    printf("\n");
}